

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O0

size_t __thiscall google::protobuf::internal::SerialArena::FreeStringBlocks(SerialArena *this)

{
  size_t unused_bytes_00;
  __pointer_type string_block;
  StringBlock *sb;
  size_t unused_bytes;
  SerialArena *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  unused_bytes_00 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
  string_block = std::atomic<google::protobuf::internal::StringBlock_*>::load
                           (&this->string_block_,memory_order_relaxed);
  if (string_block == (__pointer_type)0x0) {
    this_local = (SerialArena *)0x0;
  }
  else {
    this_local = (SerialArena *)FreeStringBlocks(string_block,unused_bytes_00);
  }
  return (size_t)this_local;
}

Assistant:

size_t FreeStringBlocks() {
    // On the active block delete all strings skipping the unused instances.
    size_t unused_bytes = string_block_unused_.load(std::memory_order_relaxed);
    if (StringBlock* sb = string_block_.load(std::memory_order_relaxed)) {
      return FreeStringBlocks(sb, unused_bytes);
    }
    return 0;
  }